

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.h
# Opt level: O2

void __thiscall
gutil::InvalidArgumentException::InvalidArgumentException
          (InvalidArgumentException *this,string *message)

{
  allocator local_39;
  string local_38 [32];
  
  std::__cxx11::string::string(local_38,"Invalid argument",&local_39);
  gutil::Exception::Exception(&this->super_Exception,local_38,(string *)message);
  std::__cxx11::string::~string(local_38);
  *(undefined ***)&this->super_Exception = &PTR__Exception_00124d20;
  return;
}

Assistant:

InvalidArgumentException(const std::string &message) :
      Exception("Invalid argument", message) { }